

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::ThreadContextTTD::ThreadContextTTD
          (ThreadContextTTD *this,ThreadContext *threadContext,void *runtimeHandle,
          uint32 snapInterval,uint32 snapHistoryLength)

{
  Recycler *pRVar1;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_00;
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  TrackAllocData local_a0;
  code *local_78;
  undefined8 local_70;
  TrackAllocData local_68;
  Recycler *local_40;
  Recycler *tctxRecycler;
  uint32 local_28;
  uint32 local_24;
  uint32 snapHistoryLength_local;
  uint32 snapInterval_local;
  void *runtimeHandle_local;
  ThreadContext *threadContext_local;
  ThreadContextTTD *this_local;
  
  this->m_threadCtx = threadContext;
  this->m_runtimeHandle = runtimeHandle;
  this->m_contextCreatedOrDestoyedInReplay = false;
  this->m_activeContext = (ScriptContext *)0x0;
  local_28 = snapHistoryLength;
  local_24 = snapInterval;
  _snapHistoryLength_local = runtimeHandle;
  runtimeHandle_local = threadContext;
  threadContext_local = (ThreadContext *)this;
  JsUtil::
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List(&this->m_contextList,&Memory::HeapAllocator::Instance,4);
  JsUtil::
  BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_ttdContextToExternalRefMap,&Memory::HeapAllocator::Instance,0);
  JsUtil::
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_ttdRootTagToObjectMap,&Memory::HeapAllocator::Instance,0);
  JsUtil::
  BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_ttdMayBeLongLivedRoot,&Memory::HeapAllocator::Instance,0);
  Memory::
  RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
  ::RecyclerRootPtr(&this->m_ttdRecordRootWeakMap);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::RecyclerRootPtr(&this->m_ttdReplayRootPinSet);
  this->SnapInterval = local_24;
  this->SnapHistoryLength = local_28;
  (this->TTDataIOInfo).ActiveTTUriLength = 0;
  (this->TTDataIOInfo).ActiveTTUri = (char *)0x0;
  (this->TTDataIOInfo).pfWriteBytesToStream = (TTDWriteBytesToStreamCallback)0x0;
  (this->TTDataIOInfo).pfFlushAndCloseStream = (TTDFlushAndCloseStreamCallback)0x0;
  (this->TTDataIOInfo).pfOpenResourceStream = (TTDOpenResourceStreamCallback)0x0;
  (this->TTDataIOInfo).pfReadBytesFromStream = (TTDReadBytesFromStreamCallback)0x0;
  (this->TTDExternalObjectFunctions).pfReleaseJsRTContextCallback =
       (TTDReleaseJsRTContextCallback)0x0;
  (this->TTDExternalObjectFunctions).pfSetActiveJsRTContext = (TTDSetActiveJsRTContext)0x0;
  (this->TTDExternalObjectFunctions).pfCreateExternalObject = (TTDCreateExternalObjectCallback)0x0;
  (this->TTDExternalObjectFunctions).pfCreateJsRTContextCallback = (TTDCreateJsRTContextCallback)0x0
  ;
  pRVar1 = ThreadContext::GetRecycler(this->m_threadCtx);
  local_40 = pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,
             (type_info *)
             &JsUtil::
              WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
             ,0x3a);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_68);
  local_78 = Memory::Recycler::AllocInlined;
  local_70 = 0;
  this_00 = (WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
             *)new<Memory::Recycler>(0x50,pRVar1,0x43c4b0);
  JsUtil::
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  ::WeaklyReferencedKeyDictionary(this_00,local_40,0,(EntryRemovalCallback *)0x0);
  Memory::
  RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
  ::Root(&this->m_ttdRecordRootWeakMap,this_00,local_40);
  pRVar1 = local_40;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a0,
             (type_info *)
             &JsUtil::
              BaseHashSet<Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::RecyclableObject*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
             ,0x3b);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_a0);
  this_01 = (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar1,0x43c4b0);
  JsUtil::
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(this_01,local_40,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->m_ttdReplayRootPinSet,this_01,local_40);
  return;
}

Assistant:

ThreadContextTTD::ThreadContextTTD(ThreadContext* threadContext, void* runtimeHandle, uint32 snapInterval, uint32 snapHistoryLength)
        : m_threadCtx(threadContext), m_runtimeHandle(runtimeHandle), m_contextCreatedOrDestoyedInReplay(false),
        SnapInterval(snapInterval), SnapHistoryLength(snapHistoryLength),
        m_activeContext(nullptr), m_contextList(&HeapAllocator::Instance), m_ttdContextToExternalRefMap(&HeapAllocator::Instance),
        m_ttdRootTagToObjectMap(&HeapAllocator::Instance), m_ttdMayBeLongLivedRoot(&HeapAllocator::Instance),
        m_ttdRecordRootWeakMap(),m_ttdReplayRootPinSet(),
        TTDataIOInfo({ 0 }), TTDExternalObjectFunctions({ 0 })
    {
        Recycler* tctxRecycler = this->m_threadCtx->GetRecycler();

        this->m_ttdRecordRootWeakMap.Root(RecyclerNew(tctxRecycler, RecordRootMap, tctxRecycler), tctxRecycler);
        this->m_ttdReplayRootPinSet.Root(RecyclerNew(tctxRecycler, ObjectPinSet, tctxRecycler), tctxRecycler);
    }